

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  Value local_80;
  undefined4 local_58;
  undefined1 local_48 [8];
  Value decoded;
  Token *token_local;
  Reader *this_local;
  
  decoded.limit_ = (size_t)token;
  Value::Value((Value *)local_48,nullValue);
  bVar1 = decodeDouble(this,(Token *)decoded.limit_,(Value *)local_48);
  if (bVar1) {
    Value::Value(&local_80,(Value *)local_48);
    pVVar2 = currentValue(this);
    Value::operator=(pVVar2,&local_80);
    Value::~Value(&local_80);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,*(long *)(decoded.limit_ + 8) - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,*(long *)(decoded.limit_ + 0x10) - (long)this->begin_);
  }
  local_58 = 1;
  Value::~Value((Value *)local_48);
  return bVar1;
}

Assistant:

bool Reader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}